

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::DepthCase::iterate(DepthCase *this)

{
  ContextType *this_00;
  RenderContext *context_00;
  TestLog *log;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  ChannelOrder CVar4;
  ChannelType CVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  char *pcVar8;
  char *pcVar9;
  int width;
  int height;
  bool bVar10;
  Surface refFrame;
  Surface gles2Frame;
  ReferenceContextBuffers buffers;
  Random rnd;
  code *local_62b0;
  deUint32 local_62a8;
  MultisamplePixelBufferAccess local_6258;
  MultisamplePixelBufferAccess local_6230;
  MultisamplePixelBufferAccess local_6208;
  GLContext context;
  int *piVar7;
  
  context_00 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*context_00->_vptr_RenderContext[4])(context_00);
  piVar7 = (int *)CONCAT44(extraout_var,iVar2);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar3 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar3);
  iVar2 = *piVar7;
  width = 0x80;
  if (iVar2 < 0x80) {
    width = iVar2;
  }
  height = 0x80;
  if (piVar7[1] < 0x80) {
    height = piVar7[1];
  }
  CVar4 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar2 - width);
  CVar5 = de::Random::getInt((Random *)&rnd.m_rnd,0,piVar7[1] - height);
  tcu::Surface::Surface(&gles2Frame,width,height);
  tcu::Surface::Surface(&refFrame,width,height);
  buffers.m_colorbuffer.m_format.type = CVar5;
  buffers.m_colorbuffer.m_format.order = CVar4;
  buffers.m_colorbuffer.m_size.m_data[0] = width;
  buffers.m_colorbuffer.m_size.m_data[1] = height;
  sglr::GLContext::GLContext(&context,context_00,log,1,(IVec4 *)&buffers);
  sglr::GLContext::clearColor(&context,0.125,0.25,0.5,1.0);
  sglr::GLContext::clear(&context,0x4500);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,&context);
  sglr::Context::readPixels(&context.super_Context,&gles2Frame,0,0,width,height);
  dVar3 = sglr::GLContext::getError(&context);
  sglr::GLContext::~GLContext(&context);
  context.super_Context._12_4_ = (uint)(piVar7[5] != 0) << 3;
  context.super_Context._vptr_Context = (_func_int **)0x800000008;
  context.super_Context.m_type.super_ApiType.m_bits = (ApiType)8;
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&buffers,(PixelFormat *)&context,piVar7[6],piVar7[7],width,height,1);
  sglr::ReferenceContextLimits::ReferenceContextLimits
            ((ReferenceContextLimits *)&local_62b0,context_00);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_6208,&buffers);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_6230,&buffers);
  sglr::ReferenceContextBuffers::getStencilbuffer(&local_6258,&buffers);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)&context,(ReferenceContextLimits *)&local_62b0,&local_6208,
             &local_6230,&local_6258);
  sglr::ReferenceContextLimits::~ReferenceContextLimits((ReferenceContextLimits *)&local_62b0);
  sglr::ReferenceContext::clearColor((ReferenceContext *)&context,0.125,0.25,0.5,1.0);
  sglr::ReferenceContext::clear((ReferenceContext *)&context,0x4500);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,&context);
  sglr::Context::readPixels(&context.super_Context,&refFrame,0,0,width,height);
  dVar6 = sglr::ReferenceContext::getError((ReferenceContext *)&context);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)&context);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers(&buffers);
  if (dVar3 == dVar6) {
    pcVar8 = (char *)0x0;
  }
  else {
    this_00 = &context.super_Context.m_type;
    context.super_Context._vptr_Context = (_func_int **)log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Error code mismatch: got ");
    buffers.m_colorbuffer.m_format = (TextureFormat)glu::getErrorName;
    buffers.m_colorbuffer.m_size.m_data[0] = dVar3;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&buffers,(ostream *)this_00);
    std::operator<<((ostream *)this_00,", expected ");
    local_62b0 = glu::getErrorName;
    local_62a8 = dVar6;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_62b0,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&context,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    pcVar8 = "Got unexpected error";
  }
  bVar1 = tcu::fuzzyCompare(log,"ComparisonResult","Image comparison result",&refFrame,&gles2Frame,
                            0.02,COMPARE_LOG_RESULT);
  bVar10 = dVar3 != dVar6;
  pcVar9 = "Image comparison failed";
  if (bVar10) {
    pcVar9 = pcVar8;
  }
  if (bVar1) {
    pcVar9 = pcVar8;
  }
  pcVar8 = "Pass";
  if (bVar10 || !bVar1) {
    pcVar8 = pcVar9;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar10 || !bVar1)
             ,pcVar8);
  tcu::Surface::~Surface(&refFrame);
  tcu::Surface::~Surface(&gles2Frame);
  return STOP;
}

Assistant:

TestCase::IterateResult DepthCase::iterate (void)
{
	tcu::Vec4					clearColor				= tcu::Vec4(0.125f, 0.25f, 0.5f, 1.0f);
	glu::RenderContext&			renderCtx				= m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget			= renderCtx.getRenderTarget();
	tcu::TestLog&				log						= m_testCtx.getLog();
	const char*					failReason				= DE_NULL;

	// Position & size for context
	de::Random rnd(deStringHash(getName()));

	int		width	= deMin32(renderTarget.getWidth(),	128);
	int		height	= deMin32(renderTarget.getHeight(),	128);
	int		x		= rnd.getInt(0, renderTarget.getWidth()		- width);
	int		y		= rnd.getInt(0, renderTarget.getHeight()	- height);

	tcu::Surface	gles2Frame	(width, height);
	tcu::Surface	refFrame	(width, height);
	deUint32		gles2Error;
	deUint32		refError;

	// Render using GLES2
	{
		sglr::GLContext context(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));

		context.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		render(context); // Call actual render func
		context.readPixels(gles2Frame, 0, 0, width, height);
		gles2Error = context.getError();
	}

	// Render reference image
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), renderTarget.getDepthBits(), renderTarget.getStencilBits(), width, height);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(renderCtx), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		context.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		render(context);
		context.readPixels(refFrame, 0, 0, width, height);
		refError = context.getError();
	}

	// Compare error codes
	bool errorCodesOk = (gles2Error == refError);

	if (!errorCodesOk)
	{
		log << tcu::TestLog::Message << "Error code mismatch: got " << glu::getErrorStr(gles2Error) << ", expected " << glu::getErrorStr(refError) << tcu::TestLog::EndMessage;
		failReason = "Got unexpected error";
	}

	// Compare images
	const float		threshold	= 0.02f;
	bool			imagesOk	= tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, gles2Frame, threshold, tcu::COMPARE_LOG_RESULT);

	if (!imagesOk && !failReason)
		failReason = "Image comparison failed";

	// Store test result
	bool isOk = errorCodesOk && imagesOk;
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: failReason);

	return STOP;
}